

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::EndGroup(void)

{
  ImVector<ImGuiGroupData> *this;
  undefined4 uVar1;
  undefined4 text_offset_y;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  value_type *pvVar4;
  float fVar5;
  ImGuiContext *g;
  uint uVar6;
  uint uVar7;
  float fVar8;
  ImVec2 IVar9;
  float fVar10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  ImRect local_68;
  undefined1 local_58 [16];
  ImVec2 local_48;
  undefined8 uStack_40;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  ImVec2 local_28;
  
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->Accessed = true;
  if ((pIVar2->DC).GroupStack.Size != 0) {
    this = &(pIVar2->DC).GroupStack;
    pvVar4 = ImVector<ImGuiGroupData>::back(this);
    local_68.Min = pvVar4->BackupCursorPos;
    IVar9 = (pIVar2->DC).CursorMaxPos;
    fVar5 = IVar9.y;
    fVar10 = fVar5 - (pIVar3->Style).ItemSpacing.y;
    fVar8 = IVar9.x;
    local_38 = local_68.Min.y;
    uVar6 = -(uint)(fVar8 <= local_68.Min.x);
    uVar7 = -(uint)(fVar10 <= local_38);
    uStack_40 = 0;
    auVar11._0_4_ = (uint)local_68.Min.x & uVar6;
    auVar11._4_4_ = (uint)local_38 & uVar7;
    auVar11._8_4_ = 0;
    auVar12._0_4_ = ~uVar6 & (uint)fVar8;
    auVar12._4_4_ = ~uVar7 & (uint)fVar10;
    auVar12._8_4_ = ~-(uint)(fVar5 <= 0.0) & (uint)fVar5;
    local_58._12_4_ = 0;
    local_58._0_12_ = auVar12 | auVar11;
    local_68.Max = SUB128(auVar12 | auVar11,0);
    (pIVar2->DC).CursorPos = local_68.Min;
    local_48 = local_68.Min;
    fStack_34 = local_38;
    fStack_30 = local_38;
    fStack_2c = local_38;
    IVar9 = ImMax(&pvVar4->BackupCursorMaxPos,&(pIVar2->DC).CursorMaxPos);
    (pIVar2->DC).CursorMaxPos = IVar9;
    uVar1 = pvVar4->BackupCurrentLineHeight;
    text_offset_y = pvVar4->BackupCurrentLineTextBaseOffset;
    (pIVar2->DC).CurrentLineHeight = (float)uVar1;
    (pIVar2->DC).CurrentLineTextBaseOffset = (float)text_offset_y;
    fVar5 = pvVar4->BackupGroupOffsetX;
    (pIVar2->DC).IndentX = pvVar4->BackupIndentX;
    (pIVar2->DC).GroupOffsetX = fVar5;
    (pIVar2->DC).LogLinePosY = local_38 + -9999.0;
    if (pvVar4->AdvanceCursor == true) {
      fVar5 = (pIVar2->DC).PrevLineTextBaseOffset;
      uVar6 = -(uint)((float)text_offset_y <= fVar5);
      (pIVar2->DC).CurrentLineTextBaseOffset = (float)(~uVar6 & text_offset_y | (uint)fVar5 & uVar6)
      ;
      local_28.x = (float)local_58._0_4_ - local_48.x;
      local_28.y = (float)local_58._4_4_ - local_48.y;
      ItemSize(&local_28,(float)text_offset_y);
      ItemAdd(&local_68,(ImGuiID *)0x0);
    }
    if ((((pvVar4->BackupActiveIdIsAlive == false) && (pIVar3->ActiveIdIsAlive == true)) &&
        (pIVar3->ActiveId != 0)) && (pIVar3->ActiveIdWindow->RootWindow == pIVar2->RootWindow)) {
      (pIVar2->DC).LastItemId = pIVar3->ActiveId;
    }
    ImVector<ImGuiGroupData>::pop_back(this);
    return;
  }
  __assert_fail("!window->DC.GroupStack.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                ,0x23d6,"void ImGui::EndGroup()");
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(!window->DC.GroupStack.empty());	// Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = window->DC.GroupStack.back();

    ImRect group_bb(group_data.BackupCursorPos, window->DC.CursorMaxPos);
    group_bb.Max.y -= g.Style.ItemSpacing.y;      // Cancel out last vertical spacing because we are adding one ourselves.
    group_bb.Max = ImMax(group_bb.Min, group_bb.Max);

    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, window->DC.CursorMaxPos);
    window->DC.CurrentLineHeight = group_data.BackupCurrentLineHeight;
    window->DC.CurrentLineTextBaseOffset = group_data.BackupCurrentLineTextBaseOffset;
    window->DC.IndentX = group_data.BackupIndentX;
    window->DC.GroupOffsetX = group_data.BackupGroupOffsetX;
    window->DC.LogLinePosY = window->DC.CursorPos.y - 9999.0f;

    if (group_data.AdvanceCursor)
    {
        window->DC.CurrentLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrentLineTextBaseOffset);      // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
        ItemSize(group_bb.GetSize(), group_data.BackupCurrentLineTextBaseOffset);
        ItemAdd(group_bb, NULL);
    }

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive() will function on the entire group.
    // It would be be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but if you search for LastItemId you'll notice it is only used in that context.
    if (!group_data.BackupActiveIdIsAlive && g.ActiveIdIsAlive && g.ActiveId && g.ActiveIdWindow->RootWindow == window->RootWindow)
        window->DC.LastItemId = g.ActiveId;

    window->DC.GroupStack.pop_back();

    //window->DrawList->AddRect(group_bb.Min, group_bb.Max, 0xFFFF00FF);   // Debug
}